

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RenderingSingleCellsPreservesRenditionPositions(RendererTests *this)

{
  cell *pcVar1;
  int iVar2;
  int iVar3;
  cell *pcVar4;
  int iVar5;
  int cover;
  uint uVar6;
  allocator local_111;
  string local_110;
  cell cells2 [1];
  LocationInfo local_e0;
  span reference2 [1];
  scanline_mockup sl2;
  scanline_mockup sl1;
  span reference1 [1];
  cell cells1 [1];
  
  sl1.excepted_y = -1000000;
  sl1.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sl1.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sl1.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sl1._inprogress = true;
  sl1._current_y = 0x7fffffff;
  sl2.excepted_y = -1000000;
  sl2.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sl2.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sl2.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sl2._inprogress = true;
  sl2._current_y = 0x7fffffff;
  cells1[0].x = 7;
  cells1[0].area = 0x1400;
  cells1[0].cover = 0;
  cells2[0].x = 0x13d62b;
  cells2[0].area = 0x1600;
  cells2[0].cover = 0;
  uVar6 = 0;
  pcVar4 = cells1;
  iVar2 = 7;
  do {
    iVar5 = iVar2;
    iVar2 = 0;
    do {
      pcVar1 = pcVar4;
      pcVar4 = pcVar1 + 1;
      iVar2 = iVar2 + pcVar1->area;
      uVar6 = uVar6 + pcVar1->cover;
      if (pcVar1 == cells1) break;
    } while (pcVar4->x == iVar5);
    if (iVar2 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&sl1,iVar5,uVar6 * 0x200 - iVar2);
      iVar5 = iVar5 + 1;
    }
    if (pcVar1 == cells1) {
      reference1[0].y = 0x7fffffff;
      reference1[0].x = 7;
      reference1[0].length = 0;
      reference1[0].cover = -0x1400;
      std::__cxx11::string::string
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,(allocator *)reference2);
      ut::LocationInfo::LocationInfo(&local_e0,&local_110,0x65);
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                (&reference1,&sl1.spans_log,&local_e0);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      uVar6 = 0;
      iVar2 = 0x13d62b;
      pcVar4 = cells2;
      do {
        iVar5 = 0;
        do {
          pcVar1 = pcVar4;
          pcVar4 = pcVar1 + 1;
          iVar5 = iVar5 + pcVar1->area;
          uVar6 = uVar6 + pcVar1->cover;
          if (pcVar1 == cells2) break;
        } while (pcVar4->x == iVar2);
        iVar3 = iVar2;
        if (iVar5 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&sl2,iVar2,uVar6 * 0x200 - iVar5);
          iVar3 = iVar2 + 1;
        }
        if (pcVar1 == cells2) {
          reference2[0].y = 0x7fffffff;
          reference2[0].x = 0x13d62b;
          reference2[0].length = 0;
          reference2[0].cover = -0x1600;
          std::__cxx11::string::string
                    ((string *)&local_110,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,&local_111);
          ut::LocationInfo::LocationInfo(&local_e0,&local_110,0x6d);
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    (&reference2,&sl2.spans_log,&local_e0);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          anon_unknown_1::scanline_mockup::~scanline_mockup(&sl2);
          anon_unknown_1::scanline_mockup::~scanline_mockup(&sl1);
          return;
        }
        iVar2 = pcVar4->x;
        if ((uVar6 & 0x7fffff) != 0 && iVar2 - iVar3 != 0) {
          anon_unknown_1::scanline_mockup::add_span(&sl2,iVar3,iVar2 - iVar3,uVar6 * 0x200);
          iVar2 = pcVar4->x;
        }
      } while( true );
    }
    iVar3 = pcVar4->x - iVar5;
    iVar2 = pcVar4->x;
    if ((uVar6 & 0x7fffff) != 0 && iVar3 != 0) {
      anon_unknown_1::scanline_mockup::add_span(&sl1,iVar5,iVar3,uVar6 * 0x200);
      iVar2 = pcVar4->x;
    }
  } while( true );
}

Assistant:

test( RenderingSingleCellsPreservesRenditionPositions )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 7, 10 * 512, 0 }, }, cells2[] = { { 1300011, 11 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = { { 0x7fffffff, 7, 0, -10 * 512 }, };

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());

				// ASSERT
				span reference2[] = { { 0x7fffffff, 1300011, 0, -11 * 512 }, };

				assert_equal(reference2, sl2.spans_log);
			}